

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O3

SRes SzReadAndDecodePackedStreams
               (ILookInStream *inStream,CSzData *sd,CBuf *tempBufs,UInt32 numFoldersMax,
               UInt64 baseOffset,CSzAr *p,ISzAlloc *allocTemp)

{
  size_t sVar1;
  SRes SVar2;
  Byte *pBVar3;
  UInt64 startPos;
  size_t *psVar4;
  ulong uVar5;
  ulong uVar6;
  CSubStreamInfo ssi;
  CSubStreamInfo *ssi_00;
  ISzAlloc *in_stack_ffffffffffffff70;
  UInt64 local_78;
  UInt64 local_70;
  CSubStreamInfo local_68;
  
  local_78 = 0;
  ssi_00 = &local_68;
  SVar2 = SzReadStreamsInfo(p,sd,numFoldersMax,(CBuf *)0x0,0,&local_78,ssi_00,
                            in_stack_ffffffffffffff70);
  if (SVar2 == 0) {
    uVar6 = (ulong)p->NumFolders;
    if (uVar6 == 0) {
      SVar2 = 0x10;
    }
    else {
      SVar2 = 4;
      if (p->NumFolders <= numFoldersMax) {
        startPos = baseOffset + local_78;
        uVar5 = 0;
        memset(tempBufs,0,uVar6 << 4);
        psVar4 = &tempBufs->size;
        do {
          sVar1 = p->CoderUnpackSizes
                  [(uint)p->FoToMainUnpackSizeIndex[uVar5] + p->FoToCoderUnpackSizes[uVar5]];
          *psVar4 = 0;
          if (sVar1 == 0) {
            ((CBuf *)(psVar4 + -1))->data = (Byte *)0x0;
          }
          else {
            pBVar3 = (Byte *)(*SZIP_SzAlloc.Alloc)(&SZIP_SzAlloc,sVar1);
            ((CBuf *)(psVar4 + -1))->data = pBVar3;
            if (pBVar3 == (Byte *)0x0) {
              return 2;
            }
            *psVar4 = sVar1;
          }
          uVar5 = uVar5 + 1;
          psVar4 = psVar4 + 2;
        } while (uVar6 != uVar5);
        psVar4 = &tempBufs->size;
        uVar5 = 0;
        do {
          local_70 = startPos;
          SVar2 = (*inStream->Seek)(inStream,(Int64 *)&local_70,SZ_SEEK_SET);
          if (SVar2 != 0) {
            return SVar2;
          }
          SVar2 = SzAr_DecodeFolder(p,(UInt32)uVar5,inStream,startPos,((CBuf *)(psVar4 + -1))->data,
                                    *psVar4,(ISzAlloc *)ssi_00);
          if (SVar2 != 0) {
            return SVar2;
          }
          uVar5 = uVar5 + 1;
          psVar4 = psVar4 + 2;
          SVar2 = 0;
        } while (uVar6 != uVar5);
      }
    }
  }
  return SVar2;
}

Assistant:

static SRes SzReadAndDecodePackedStreams(
    ILookInStream *inStream,
    CSzData *sd,
    CBuf *tempBufs,
    UInt32 numFoldersMax,
    UInt64 baseOffset,
    CSzAr *p,
    ISzAlloc *allocTemp)
{
  UInt64 dataStartPos = 0;
  UInt32 fo;
  CSubStreamInfo ssi;
  UInt32 numFolders;

  RINOK(SzReadStreamsInfo(p, sd, numFoldersMax, NULL, 0, &dataStartPos, &ssi, allocTemp));

  numFolders = p->NumFolders;
  if (numFolders == 0)
    return SZ_ERROR_ARCHIVE;
  else if (numFolders > numFoldersMax)
    return SZ_ERROR_UNSUPPORTED;

  dataStartPos += baseOffset;

  for (fo = 0; fo < numFolders; fo++)
    Buf_Init(tempBufs + fo);
  
  for (fo = 0; fo < numFolders; fo++)
  {
    CBuf *tempBuf = tempBufs + fo;
    UInt64 unpackSize = SzAr_GetFolderUnpackSize(p, fo);
    if ((size_t)unpackSize != unpackSize)
      return SZ_ERROR_MEM;
    if (!Buf_Create(tempBuf, (size_t)unpackSize, allocTemp))
      return SZ_ERROR_MEM;
  }
  
  for (fo = 0; fo < numFolders; fo++)
  {
    const CBuf *tempBuf = tempBufs + fo;
    RINOK(LookInStream_SeekTo(inStream, dataStartPos));
    RINOK(SzAr_DecodeFolder(p, fo, inStream, dataStartPos, tempBuf->data, tempBuf->size, allocTemp));
  }
  
  return SZ_OK;
}